

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O0

void garray_arrayviewlist_fillpage(_garray *x,t_float fPage,t_float fTopItem)

{
  int iVar1;
  uint local_44;
  t_word *local_40;
  t_word *data;
  int length;
  int offset;
  int maxpage;
  int page;
  int pagesize;
  int topItem;
  int size;
  int i;
  t_float fTopItem_local;
  t_float fPage_local;
  _garray *x_local;
  
  pagesize = 0;
  page = (int)fTopItem;
  maxpage = 1000;
  offset = (int)fPage;
  local_40 = (t_word *)0x0;
  size = (int)fTopItem;
  i = (int)fPage;
  _fTopItem_local = x;
  iVar1 = garray_getfloatwords(x,&pagesize,&local_40);
  if (iVar1 == 0) {
    pd_error(_fTopItem_local,"error in %s()","garray_arrayviewlist_fillpage");
  }
  else {
    length = (pagesize + -1) / maxpage;
    if (length < offset) {
      offset = length;
    }
    if (offset < 0) {
      offset = 0;
    }
    pdgui_vmess("::dialog_array::listview_setpage","s iii",_fTopItem_local->x_realname->s_name,
                (ulong)(uint)offset,(ulong)(length + 1),(ulong)(uint)maxpage);
    data._4_4_ = offset * maxpage;
    if (pagesize < (int)(data._4_4_ + maxpage)) {
      local_44 = pagesize - data._4_4_;
    }
    else {
      local_44 = maxpage;
    }
    data._0_4_ = local_44;
    pdgui_vmess("::dialog_array::listview_setdata","siw",_fTopItem_local->x_realname->s_name,
                (ulong)data._4_4_,(ulong)local_44,local_40 + (int)data._4_4_);
    pdgui_vmess("::dialog_array::listview_focus","si",_fTopItem_local->x_realname->s_name,
                (ulong)(uint)page);
  }
  return;
}

Assistant:

static void garray_arrayviewlist_fillpage(t_garray *x,
                                   t_float fPage,
                                   t_float fTopItem)
{
    int i, size=0, topItem=(int)fTopItem;
    int pagesize=ARRAYPAGESIZE, page=(int)fPage, maxpage;
    int offset, length;
    t_word *data=0;

    if(!garray_getfloatwords(x, &size, &data)) {
        pd_error(x, "error in %s()", __FUNCTION__);
        return;
    }

        /* make sure the requested page is within range */
    maxpage = (size - 1) / pagesize;
    if(page > maxpage)
        page = maxpage;
    if(page < 0)
        page = 0;

    pdgui_vmess("::dialog_array::listview_setpage", "s iii",
        x->x_realname->s_name,
        page, maxpage+1, pagesize);

    offset = page*pagesize;
    length = ((offset+pagesize) > size)?size-offset:pagesize;

    pdgui_vmess("::dialog_array::listview_setdata", "siw",
             x->x_realname->s_name,
             offset,
             length, data + offset);

    pdgui_vmess("::dialog_array::listview_focus", "si",
             x->x_realname->s_name,
             topItem);
}